

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationTest.cpp
# Opt level: O0

void __thiscall TestReadConfigurationFile_Aliases::Run(TestReadConfigurationFile_Aliases *this)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  size_type sVar3;
  runtime_error *prVar4;
  size_t in_RCX;
  void *__buf;
  bool bVar5;
  bool v_7;
  bool v_6;
  bool v_5;
  bool v_4;
  bool v_3;
  bool v_2;
  bool v_1;
  bool v;
  Configuration config;
  stringstream ss;
  key_type *in_stack_fffffffffffff9e8;
  Configuration *in_stack_fffffffffffff9f0;
  allocator local_4c1;
  string local_4c0 [32];
  undefined6 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb66;
  allocator in_stack_fffffffffffffb67;
  string local_498 [38];
  undefined1 local_472;
  allocator local_471;
  string local_470 [37];
  undefined1 local_44b;
  undefined1 local_44a;
  allocator local_449;
  string local_448 [38];
  undefined1 local_422;
  allocator local_421;
  string local_420 [38];
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8 [38];
  undefined1 local_3d2;
  undefined1 local_3d1;
  Configuration local_3d0;
  allocator local_1b1;
  string local_1b0 [32];
  stringstream local_190 [16];
  ostream local_180;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"config-cpp-dependencies.txt",&local_1b1);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_190,local_1b0,_Var1);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  poVar2 = std::operator<<(&local_180,"addLibraryAlias: [\n");
  poVar2 = std::operator<<(poVar2,"      add_special_library  \n");
  poVar2 = std::operator<<(poVar2,"      add_test_lib\n");
  poVar2 = std::operator<<(poVar2,"     ]\n");
  poVar2 = std::operator<<(poVar2,"addExecutableAlias: [\n");
  poVar2 = std::operator<<(poVar2,"         add_special_exe\n");
  poVar2 = std::operator<<(poVar2,"add_test\n");
  std::operator<<(poVar2,"]\n");
  Configuration::Configuration
            ((Configuration *)
             CONCAT17(in_stack_fffffffffffffb67,
                      CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)));
  Configuration::read(&local_3d0,(int)local_190,__buf,in_RCX);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x160166);
  local_3d1 = sVar3 == 3;
  if (!(bool)local_3d1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.size() == 3");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"add_library",&local_3f9);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  bVar5 = sVar3 == 1;
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  local_3d2 = bVar5;
  if (!bVar5) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.count(\"add_library\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"add_special_library",&local_421);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  bVar5 = sVar3 == 1;
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  local_3fa = bVar5;
  if (!bVar5) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,
               "Assertion failed: config.addLibraryAliases.count(\"add_special_library\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"add_test_lib",&local_449);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  bVar5 = sVar3 == 1;
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  local_422 = bVar5;
  if (!bVar5) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.count(\"add_test_lib\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1606c6);
  local_44a = sVar3 == 3;
  if (!(bool)local_44a) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addExecutableAliases.size() == 3");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"add_executable",&local_471);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  bVar5 = sVar3 == 1;
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  local_44b = bVar5;
  if (!bVar5) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addExecutableAliases.count(\"add_executable\") == 1"
              );
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"add_special_exe",(allocator *)&stack0xfffffffffffffb67);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  bVar5 = sVar3 == 1;
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb67);
  local_472 = bVar5;
  if (!bVar5) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,
               "Assertion failed: config.addExecutableAliases.count(\"add_special_exe\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"add_test",&local_4c1);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  if (sVar3 != 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addExecutableAliases.count(\"add_test\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Configuration::~Configuration(in_stack_fffffffffffff9f0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

TEST(ReadConfigurationFile_Aliases)
{
  std::stringstream ss(CONFIG_FILE);
  ss << "addLibraryAlias: [\n"
     << "      add_special_library  \n"
     << "      add_test_lib\n"
     << "     ]\n"
     << "addExecutableAlias: [\n"
     << "         add_special_exe\n"
     << "add_test\n"
     << "]\n";

  Configuration config;
  config.read(ss);
  ASSERT(config.addLibraryAliases.size() == 3);
  ASSERT(config.addLibraryAliases.count("add_library") == 1);
  ASSERT(config.addLibraryAliases.count("add_special_library") == 1);
  ASSERT(config.addLibraryAliases.count("add_test_lib") == 1);

  ASSERT(config.addExecutableAliases.size() == 3);
  ASSERT(config.addExecutableAliases.count("add_executable") == 1);
  ASSERT(config.addExecutableAliases.count("add_special_exe") == 1);
  ASSERT(config.addExecutableAliases.count("add_test") == 1);
}